

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

Test * __thiscall
testing::internal::
ParameterizedTestFactory<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTest_FindFileByName_Test>
::CreateTest(ParameterizedTestFactory<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTest_FindFileByName_Test>
             *this)

{
  Test *this_00;
  
  WithParamInterface<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase*(*)()>::
  parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x28);
  Test::Test(this_00);
  this_00[1].gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)0x0;
  this_00->_vptr_Test = (_func_int **)&PTR__DescriptorDatabaseTest_018d31d0;
  this_00[1]._vptr_Test = (_func_int **)&DAT_018d3210;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }